

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::DescriptorProto_ExtensionRange>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  RepeatedPtrFieldBase *from_local;
  RepeatedPtrFieldBase *this_local;
  
  MergeFromConcreteMessage
            (this,from,Arena::CopyConstruct<google::protobuf::DescriptorProto_ExtensionRange>);
  return;
}

Assistant:

void MergeFrom(const RepeatedPtrFieldBase& from) {
    static_assert(std::is_base_of<MessageLite, T>::value, "");
#ifdef __cpp_if_constexpr
    if constexpr (!std::is_base_of<Message, T>::value) {
      // For LITE objects we use the generic MergeFrom to save on binary size.
      return MergeFrom<MessageLite>(from);
    }
#endif
    MergeFromConcreteMessage(from, Arena::CopyConstruct<T>);
  }